

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O0

void scan_ranges(void)

{
  rtosc_print_options simplefloats;
  rtosc_print_options uncompressed;
  char *in_stack_00000240;
  int in_stack_0000024c;
  char *in_stack_00000250;
  rtosc_print_options *in_stack_00000258;
  char *in_stack_00000260;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  rtosc_print_options *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  rtosc_print_options local_18;
  
  make_print_options(&local_18,false,3," ",0x50,0);
  make_print_options((rtosc_print_options *)&stack0xffffffffffffffd0,false,2," ",0x50,1);
  check(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
        in_stack_ffffffffffffffcc);
  check(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
        in_stack_ffffffffffffffcc);
  check(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
        in_stack_ffffffffffffffcc);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  check_alt(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_0000024c,
            in_stack_00000240);
  return;
}

Assistant:

void scan_ranges()
{
    /*
        no range conversion
     */
    auto uncompressed = make_print_options(false, 3, " ", 80, false);
    auto simplefloats = make_print_options(false, 2, " ", 80, true);
    check("0 1 2 3", NULL, "too less args for range conversion", __LINE__);
    check("0.00 1.00 2.00 3.00 4.00", &simplefloats,
          "wrong type for range conversion", __LINE__);
    check("0 1 2 3 4", &uncompressed,
          "no range conversion due to opts", __LINE__);

    /*
        with delta
     */
    check_alt("1 2 3 4 5 6 7", NULL,
              "convert to simple upwards integer range", __LINE__,
              "1 ... 7");
    check_alt("-3 -4 -5 -6 -7", NULL,
              "convert to simple downwards integer range", __LINE__,
              "-3 ... -7");
    check_alt("'z' 'x' 'v' 't' 'r'", NULL,
              "convert to simple downward char range", __LINE__,
              "'z' 'x' ... 'r'");
    check_alt("[4 3 2 1 0]", NULL,
              "convert to downward range in an array", __LINE__,
              "[4 ... 0]");
    check_alt("1 3 5 7 9 13 15 17 19 21", NULL,
              "convert to two almost subsequent ranges", __LINE__,
              "1 3 ... 9 13 15 ... 21");
    check_alt("[ 1 2 3 4 5 ]", NULL,
              "convert to range with delta 1 in an array", __LINE__,
              "[1 ... 5]");
    check_alt("[5 4 3 2 1 0]", NULL,
              "convert to range with delta -1 in an array", __LINE__,
              "[5 ... 0]");

    /*
        without delta
     */
    check_alt("0 0 0 0 0", NULL,
              "convert to range of 5 zeros", __LINE__, "5x0");
    check_alt("[ 0h 0h 0h 0h 0h ]", NULL,
              "convert to array with range of 5 huge ints", __LINE__, "[5x0h]");
    check_alt("[0 1] [0 1] [0 1] [0 1] [0 1]", NULL,
              "convert to range of arrays", __LINE__, "5x[0 1]");
    /*
        combined
     */
    check_alt("0.5 0.5 0.5 0.5 0.5 'a' 'b' 'c' 'd' 'e'", NULL,
              "convert to combined ranges", __LINE__,
              "5x0.50 (0x1p-1) 'a' ... 'e'");
    /* combined, but not yet implemented: */
#if 0
    check_alt("-6 -6 -6 -6 -6 -6 -5 -4 ... 0", NULL,
              "convert to combined ranges (2)", __LINE__,
              "6x-6 -5 ... 0");
    check_alt("'a' 'b' 'c' 'd' 'e' 'f' 'f' 'f' 'f' 'f' 'f'", NULL,
              "convert to combined ranges (3)", __LINE__,
              "'a' ... 'f' 6x'f'");
#endif

    /*
        endless ranges
     */
    // (you cannot convert fixed size ranges to endless ranges)
}